

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O3

void localize_option_names(CmdOptDesc *pos)

{
  ctmbstr ptVar1;
  tmbstr ptVar2;
  
  ptVar1 = tidyLocalizedString(pos->subKey);
  ptVar2 = stringWithFormat(pos->name1,ptVar1);
  pos->name1 = ptVar2;
  if (pos->name2 != (ctmbstr)0x0) {
    ptVar2 = stringWithFormat(pos->name2,ptVar1);
    pos->name2 = ptVar2;
  }
  if (pos->name3 != (ctmbstr)0x0) {
    ptVar2 = stringWithFormat(pos->name3,ptVar1);
    pos->name3 = ptVar2;
  }
  if (pos->eqconfig != (ctmbstr)0x0) {
    ptVar2 = stringWithFormat(pos->eqconfig,ptVar1);
    pos->eqconfig = ptVar2;
  }
  return;
}

Assistant:

static void localize_option_names( CmdOptDesc *pos)
{
    ctmbstr fileString = tidyLocalizedString(pos->subKey);
    pos->name1 = stringWithFormat(pos->name1, fileString);
    if ( pos->name2 )
        pos->name2 = stringWithFormat(pos->name2, fileString);
    if ( pos->name3 )
        pos->name3 = stringWithFormat(pos->name3, fileString);
    if ( pos->eqconfig )
        pos->eqconfig = stringWithFormat(pos->eqconfig, fileString);
}